

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sequence_generation.cc
# Opt level: O1

bool __thiscall sptk::MSequenceGeneration::Get(MSequenceGeneration *this,double *output)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  if (output != (double *)0x0) {
    uVar1 = this->x_;
    bVar3 = (uVar1 & 2) == 0;
    uVar2 = (uVar1 >> 1) + 0x80000000;
    if (bVar3 == ((uVar1 >> 0x1d & 1) == 0)) {
      uVar2 = uVar1 >> 1;
    }
    this->x_ = uVar2;
    *output = (double)(int)(-(uint)bVar3 | 1);
  }
  return output != (double *)0x0;
}

Assistant:

bool MSequenceGeneration::Get(double* output) {
  if (NULL == output) {
    return false;
  }

  // Generate m-sequence using X**31 + X**28 + 1.
  int x0, x28;

  x_ >>= 1;

  if (x_ & kB0) {
    x0 = 1;
  } else {
    x0 = -1;
  }

  if (x_ & kB28) {
    x28 = 1;
  } else {
    x28 = -1;
  }

  if (x0 + x28) {
    x_ &= kB31F;
  } else {
    x_ |= kB31;
  }

  *output = static_cast<double>(x0);

  return true;
}